

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GUIAbout.cpp
# Opt level: O3

void __thiscall GUIAbout::GUIAbout(GUIAbout *this)

{
  QTextDocument *this_00;
  QTextBrowser *this_01;
  WidgetAttribute WVar1;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QString html;
  QVBoxLayout layout;
  QArrayData *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  QString local_68;
  QArrayData *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  QDialog::QDialog(&this->super_QDialog,0,0);
  *(undefined ***)this = &PTR_metaObject_00120ae8;
  *(undefined ***)&this->field_0x10 = &PTR__GUIAbout_00120cc0;
  QDialog::setModal(SUB81(this,0));
  WVar1 = (WidgetAttribute)this;
  QWidget::setMinimumSize(WVar1,500);
  QWidget::setMaximumSize(WVar1,500);
  QVar2.m_data = (storage_type *)0x1;
  QVar2.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar2);
  local_88 = local_48;
  uStack_80 = uStack_40;
  local_78 = local_38;
  QWidget::setWindowTitle((QString *)this);
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,2,8);
    }
  }
  QWidget::setAttribute(WVar1,true);
  QVBoxLayout::QVBoxLayout((QVBoxLayout *)&local_48,(QWidget *)this);
  local_68.d.d = (Data *)0x0;
  local_68.d.ptr = (char16_t *)0x0;
  local_68.d.size = 0;
  QVar3.m_data = (storage_type *)0x30;
  QVar3.m_size = (qsizetype)&local_88;
  QString::fromUtf8(QVar3);
  QString::append(&local_68);
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,2,8);
    }
  }
  QVar4.m_data = (storage_type *)0x3c;
  QVar4.m_size = (qsizetype)&local_88;
  QString::fromUtf8(QVar4);
  QString::append(&local_68);
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,2,8);
    }
  }
  this_00 = (QTextDocument *)operator_new(0x10);
  QTextDocument::QTextDocument(this_00,(QObject *)this);
  QTextDocument::setHtml((QString *)this_00);
  this_01 = (QTextBrowser *)operator_new(0x28);
  QTextBrowser::QTextBrowser(this_01,(QWidget *)this);
  QTextEdit::setDocument((QTextDocument *)this_01);
  QBoxLayout::addWidget(&local_48,this_01,0,0);
  QWidget::show();
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
    }
  }
  QVBoxLayout::~QVBoxLayout((QVBoxLayout *)&local_48);
  return;
}

Assistant:

GUIAbout::GUIAbout()
{
    setModal( true );
    setMinimumSize( 500, 170 );
    setMaximumSize( 500, 170 );
    setWindowTitle( " " );
    setAttribute( Qt::WA_DeleteOnClose );

    QVBoxLayout layout( this );
    QString html;

    html.append( "<br/><pre>  Author:       Przemyslaw Madej</pre>" );
    html.append( "<pre>  Web page:     http://przemeknet.pl/fifteen.html</pre>" );

    QTextDocument* doc = new QTextDocument( this );
    doc->setHtml( html );
    QTextBrowser* browser = new QTextBrowser( this );
    browser->setDocument( doc );
    layout.addWidget( browser );
    show();
}